

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

bool __thiscall Kernel::Clause::isHorn(Clause *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  Literal **ppLVar4;
  byte bVar5;
  
  uVar2 = *(uint *)&this->field_0x38 & 0xfffff;
  uVar3 = (uint)(uVar2 != 0);
  ppLVar4 = (Literal **)0x0;
  if (uVar2 != 0) {
    ppLVar4 = this->_literals;
  }
  bVar5 = 0;
  while (ppLVar4 != (Literal **)0x0) {
    uVar1 = ((*ppLVar4)->super_Term)._args[0]._content;
    if (((uVar1 & 4) != 0) && (bVar5 == 1)) break;
    bVar5 = (byte)(((uint)uVar1 & 4) >> 2) | bVar5;
    ppLVar4 = this->_literals + (int)uVar3;
    if (uVar2 <= uVar3) {
      ppLVar4 = (Literal **)0x0;
    }
    uVar3 = uVar3 + (uVar3 < uVar2);
  }
  return ppLVar4 == (Literal **)0x0;
}

Assistant:

bool Clause::isHorn()
{
  bool posFound=false;
  for (Literal* l : iterLits()) {
    if (l->isPositive()) {
      if (posFound) {
        return false;
      }
      else {
        posFound=true;
      }
    }
  }
  return true;
}